

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateBuilder
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  MessageBuilderLiteGenerator builderGenerator;
  MessageBuilderLiteGenerator local_58;
  
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&local_58,this->name_resolver_,(this->super_MessageGenerator).descriptor_,
             true);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public static Builder newBuilder() {\n  return (Builder) DEFAULT_INSTANCE.createBuilder();\n}\npublic static Builder newBuilder($classname$ prototype) {\n  return (Builder) DEFAULT_INSTANCE.createBuilder(prototype);\n}\n\n"
             ,(char (*) [10])0x3aca6c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
  if ((Context **)local_58._vptr_MessageBuilderLiteGenerator != &local_58.context_) {
    operator_delete(local_58._vptr_MessageBuilderLiteGenerator);
  }
  MessageBuilderLiteGenerator::MessageBuilderLiteGenerator
            (&local_58,(this->super_MessageGenerator).descriptor_,this->context_);
  MessageBuilderLiteGenerator::Generate(&local_58,printer);
  MessageBuilderLiteGenerator::~MessageBuilderLiteGenerator(&local_58);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateBuilder(io::Printer* printer) {
  printer->Print(
      "public static Builder newBuilder() {\n"
      "  return (Builder) DEFAULT_INSTANCE.createBuilder();\n"
      "}\n"
      "public static Builder newBuilder($classname$ prototype) {\n"
      "  return (Builder) DEFAULT_INSTANCE.createBuilder(prototype);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  MessageBuilderLiteGenerator builderGenerator(descriptor_, context_);
  builderGenerator.Generate(printer);
}